

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

void * yang_read_type(ly_ctx *ctx,void *parent,char *value,yytokentype type)

{
  undefined1 *__ptr;
  void *pvVar1;
  LY_VLOG_ELEM elem_type;
  char *pcVar2;
  
  __ptr = (undefined1 *)calloc(1,0x18);
  if (__ptr == (undefined1 *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_read_type");
    return (void *)0x0;
  }
  *__ptr = 0x80;
  if ((type == UNION_KEYWORD) || (type == EXTENSION_INSTANCE)) {
    *(undefined1 **)((long)parent + 0x10) = __ptr;
    goto LAB_0014fd72;
  }
  if (type == LEAF_LIST_KEYWORD) {
    if (*(long *)((long)parent + 0x90) == 0) {
LAB_0014fd32:
      *(undefined1 **)((long)parent + 0x90) = __ptr;
      *(void **)((long)parent + 0x98) = parent;
      parent = (void *)((long)parent + 0x80);
LAB_0014fd72:
      *(void **)(__ptr + 0x10) = parent;
      pcVar2 = lydict_insert_zc(ctx,value);
      *(char **)(__ptr + 8) = pcVar2;
      return __ptr;
    }
    pcVar2 = "leaf-list";
LAB_0014fcd1:
    elem_type = LY_VLOG_LYS;
  }
  else {
    if (type == TYPEDEF_KEYWORD) {
      if (*(long *)((long)parent + 0x48) == 0) {
        *(undefined1 **)((long)parent + 0x48) = __ptr;
        parent = (void *)((long)parent + 0x38);
        goto LAB_0014fd72;
      }
      pcVar2 = "typedef";
    }
    else {
      if (type != REPLACE_KEYWORD) {
        if (type != LEAF_KEYWORD) goto LAB_0014fd1e;
        if (*(long *)((long)parent + 0x90) == 0) goto LAB_0014fd32;
        pcVar2 = "leaf";
        goto LAB_0014fcd1;
      }
      if (*(long *)((long)parent + 0x28) == 0) {
        pvVar1 = calloc(1,0x40);
        *(void **)((long)parent + 0x28) = pvVar1;
        if (pvVar1 != (void *)0x0) {
          *(undefined1 **)((long)pvVar1 + 0x10) = __ptr;
          parent = pvVar1;
          goto LAB_0014fd72;
        }
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_read_type");
        goto LAB_0014fd1e;
      }
      pcVar2 = "deviation";
    }
    elem_type = LY_VLOG_NONE;
    parent = (void *)0x0;
  }
  ly_vlog(ctx,LYE_TOOMANY,elem_type,parent,"type",pcVar2);
LAB_0014fd1e:
  free(value);
  free(__ptr);
  return (void *)0x0;
}

Assistant:

void *
yang_read_type(struct ly_ctx *ctx, void *parent, char *value, enum yytokentype type)
{
    struct yang_type *typ;
    struct lys_deviate *dev;

    typ = calloc(1, sizeof *typ);
    LY_CHECK_ERR_RETURN(!typ, LOGMEM(ctx), NULL);

    typ->flags = LY_YANG_STRUCTURE_FLAG;
    switch (type) {
    case LEAF_KEYWORD:
        if (((struct lys_node_leaf *)parent)->type.der) {
            LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, parent, "type", "leaf");
            goto error;
        }
        ((struct lys_node_leaf *)parent)->type.der = (struct lys_tpdf *)typ;
        ((struct lys_node_leaf *)parent)->type.parent = (struct lys_tpdf *)parent;
        typ->type = &((struct lys_node_leaf *)parent)->type;
        break;
    case LEAF_LIST_KEYWORD:
        if (((struct lys_node_leaflist *)parent)->type.der) {
            LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, parent, "type", "leaf-list");
            goto error;
        }
        ((struct lys_node_leaflist *)parent)->type.der = (struct lys_tpdf *)typ;
        ((struct lys_node_leaflist *)parent)->type.parent = (struct lys_tpdf *)parent;
        typ->type = &((struct lys_node_leaflist *)parent)->type;
        break;
    case UNION_KEYWORD:
        ((struct lys_type *)parent)->der = (struct lys_tpdf *)typ;
        typ->type = (struct lys_type *)parent;
        break;
    case TYPEDEF_KEYWORD:
        if (((struct lys_tpdf *)parent)->type.der) {
            LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, "type", "typedef");
            goto error;
        }
        ((struct lys_tpdf *)parent)->type.der = (struct lys_tpdf *)typ;
        typ->type = &((struct lys_tpdf *)parent)->type;
        break;
    case REPLACE_KEYWORD:
        /* deviation replace type*/
        dev = (struct lys_deviate *)parent;
        if (dev->type) {
            LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, "type", "deviation");
            goto error;
        }
        dev->type = calloc(1, sizeof *dev->type);
        LY_CHECK_ERR_GOTO(!dev->type, LOGMEM(ctx), error);
        dev->type->der = (struct lys_tpdf *)typ;
        typ->type = dev->type;
        break;
    case EXTENSION_INSTANCE:
        ((struct lys_type *)parent)->der = (struct lys_tpdf *)typ;
        typ->type = parent;
        break;
    default:
        goto error;
        break;
    }
    typ->name = lydict_insert_zc(ctx, value);
    return typ;

error:
    free(value);
    free(typ);
    return NULL;
}